

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int attlist1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  int iVar2;
  
  if (tok < 0x12) {
    if (tok == 0xf) {
      return 0;
    }
    if (tok == 0x11) {
      pcVar1 = internalSubset;
      if (state->documentEntity == 0) {
        pcVar1 = externalSubset1;
      }
      iVar2 = 0;
      goto LAB_001607d2;
    }
  }
  else {
    iVar2 = 0x13;
    pcVar1 = attlist2;
    if ((tok == 0x12) || (tok == 0x29)) goto LAB_001607d2;
  }
  iVar2 = -1;
  pcVar1 = error;
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x34;
  }
LAB_001607d2:
  state->handler = pcVar1;
  return iVar2;
}

Assistant:

static
int attlist1(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_NONE;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = attlist2;
    return XML_ROLE_ATTRIBUTE_NAME;
  }
  return common(state, tok);
}